

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

TestTextureCubeSp __thiscall
vkt::texture::util::loadTextureCube
          (util *this,Archive *archive,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  allocator<unsigned_char> *paVar1;
  size_t sVar2;
  bool bVar3;
  deBool dVar4;
  int iVar5;
  int iVar6;
  CompressedTexFormat format;
  int iVar7;
  size_type sVar8;
  TestError *pTVar9;
  const_reference path;
  InternalError *this_00;
  pointer puVar10;
  char *pcVar11;
  uchar *puVar12;
  TestTextureCube *pTVar13;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *pSVar14;
  TestTextureCubeSp TVar15;
  bool local_27a;
  bool local_26d;
  EVP_PKEY_CTX local_238 [44];
  TexDecompressionParams local_20c;
  SharedPtr<vkt::pipeline::TestTextureCube> local_208;
  undefined1 local_1f8 [8];
  PixelBufferAccess commonFormatBuffer;
  undefined1 local_1c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> commonFromatData;
  TextureFormat commonFormat;
  PixelBufferAccess decompressedBuffer;
  undefined1 local_178 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedData;
  TextureFormat uncompressedFormat;
  CompressedTexture level_1;
  size_t fileIndex_1;
  EVP_PKEY_CTX local_100 [40];
  TextureFormat local_d8;
  SharedPtr<vkt::pipeline::TestTextureCube> local_d0;
  TextureFormat local_c0;
  TextureFormat local_b8;
  TextureFormat local_b0;
  TextureFormat local_a8;
  undefined1 local_a0 [8];
  TextureLevel level;
  size_t fileIndex;
  undefined1 local_50 [8];
  string ext;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames_local;
  Archive *archive_local;
  TestTextureCubeSp *texture;
  
  do {
    dVar4 = ::deGetFalse();
    if ((dVar4 != 0) ||
       (sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(filenames),
       (int)((long)((ulong)(uint)((int)sVar8 >> 0x1f) << 0x20 | sVar8 & 0xffffffff) % 6) != 0)) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,(char *)0x0,"(int)filenames.size() % tcu::CUBEFACE_LAST == 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x6a9);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  ext.field_2._M_local_buf[0xb] = '\0';
  de::SharedPtr<vkt::pipeline::TestTextureCube>::SharedPtr
            ((SharedPtr<vkt::pipeline::TestTextureCube> *)this);
  path = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](filenames,0);
  de::FilePath::FilePath((FilePath *)&fileIndex,path);
  de::FilePath::getFileExtension_abi_cxx11_((string *)local_50,(FilePath *)&fileIndex);
  de::FilePath::~FilePath((FilePath *)&fileIndex);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"png");
  if (bVar3) {
    for (level.m_data.m_cap = 0; sVar2 = level.m_data.m_cap,
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(filenames), sVar2 < sVar8; level.m_data.m_cap = level.m_data.m_cap + 1) {
      tcu::TextureLevel::TextureLevel((TextureLevel *)local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](filenames,level.m_data.m_cap);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      tcu::ImageIO::loadImage((TextureLevel *)local_a0,archive,pcVar11);
      do {
        dVar4 = ::deGetFalse();
        local_26d = false;
        if (dVar4 == 0) {
          local_a8 = tcu::TextureLevel::getFormat((TextureLevel *)local_a0);
          tcu::TextureFormat::TextureFormat(&local_b0,RGBA,UNORM_INT8);
          bVar3 = tcu::TextureFormat::operator==(&local_a8,&local_b0);
          local_27a = true;
          if (!bVar3) {
            local_b8 = tcu::TextureLevel::getFormat((TextureLevel *)local_a0);
            tcu::TextureFormat::TextureFormat(&local_c0,RGB,UNORM_INT8);
            local_27a = tcu::TextureFormat::operator==(&local_b8,&local_c0);
          }
          local_26d = local_27a;
        }
        if (((local_26d ^ 0xffU) & 1) != 0) {
          this_00 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_00,(char *)0x0,
                     "level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) || level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6b9);
          __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
        }
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      do {
        dVar4 = ::deGetFalse();
        if (dVar4 != 0) {
LAB_00ecd745:
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,(char *)0x0,"level.getWidth() == level.getHeight()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6bb);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        iVar5 = tcu::TextureLevel::getWidth((TextureLevel *)local_a0);
        iVar6 = tcu::TextureLevel::getHeight((TextureLevel *)local_a0);
        if (iVar5 != iVar6) goto LAB_00ecd745;
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      if (level.m_data.m_cap == 0) {
        pTVar13 = (TestTextureCube *)operator_new(0x188);
        tcu::TextureFormat::TextureFormat(&local_d8,RGBA,UNORM_INT8);
        iVar5 = tcu::TextureLevel::getWidth((TextureLevel *)local_a0);
        vkt::pipeline::TestTextureCube::TestTextureCube(pTVar13,&local_d8,iVar5);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::SharedPtr(&local_d0,pTVar13);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::operator=
                  ((SharedPtr<vkt::pipeline::TestTextureCube> *)this,&local_d0);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::~SharedPtr(&local_d0);
      }
      pTVar13 = de::SharedPtr<vkt::pipeline::TestTextureCube>::operator->
                          ((SharedPtr<vkt::pipeline::TestTextureCube> *)this);
      (*(pTVar13->super_TestTexture)._vptr_TestTexture[7])
                (local_100,pTVar13,(ulong)(uint)((int)level.m_data.m_cap / 6),
                 (ulong)(uint)((int)level.m_data.m_cap % 6));
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&fileIndex_1,(TextureLevel *)local_a0);
      tcu::copy(local_100,(EVP_PKEY_CTX *)&fileIndex_1);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_a0);
    }
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"pkm");
    if (!bVar3) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Unsupported file format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x6e0);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (level_1.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar10 = (pointer)std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size(filenames),
        level_1.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < puVar10;
        level_1.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             level_1.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      tcu::CompressedTexture::CompressedTexture((CompressedTexture *)&uncompressedFormat);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](filenames,
                   (size_type)
                   level_1.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      tcu::ImageIO::loadPKM((CompressedTexture *)&uncompressedFormat,archive,pcVar11);
      do {
        dVar4 = ::deGetFalse();
        if (dVar4 != 0) {
LAB_00ecda4f:
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,(char *)0x0,"level.getWidth() == level.getHeight()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6cc);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        iVar5 = tcu::CompressedTexture::getWidth((CompressedTexture *)&uncompressedFormat);
        iVar6 = tcu::CompressedTexture::getHeight((CompressedTexture *)&uncompressedFormat);
        if (iVar5 != iVar6) goto LAB_00ecda4f;
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      format = tcu::CompressedTexture::getFormat((CompressedTexture *)&uncompressedFormat);
      uncompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)tcu::getUncompressedFormat(format);
      iVar5 = tcu::TextureFormat::getPixelSize
                        ((TextureFormat *)
                         &uncompressedData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      iVar6 = tcu::CompressedTexture::getWidth((CompressedTexture *)&uncompressedFormat);
      iVar7 = tcu::CompressedTexture::getHeight((CompressedTexture *)&uncompressedFormat);
      decompressedBuffer.super_ConstPixelBufferAccess.m_data._7_1_ = 0;
      paVar1 = (allocator<unsigned_char> *)
               ((long)&decompressedBuffer.super_ConstPixelBufferAccess.m_data + 6);
      std::allocator<unsigned_char>::allocator(paVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,
                 (long)(iVar5 * iVar6 * iVar7),
                 (value_type_conflict3 *)
                 ((long)&decompressedBuffer.super_ConstPixelBufferAccess.m_data + 7),paVar1);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&decompressedBuffer.super_ConstPixelBufferAccess.m_data + 6));
      iVar5 = tcu::CompressedTexture::getWidth((CompressedTexture *)&uncompressedFormat);
      iVar6 = tcu::CompressedTexture::getHeight((CompressedTexture *)&uncompressedFormat);
      puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&commonFormat,
                 (TextureFormat *)
                 &uncompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar5,iVar6,1,puVar12);
      tcu::TextureFormat::TextureFormat
                ((TextureFormat *)
                 &commonFromatData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,RGBA,UNORM_INT8);
      iVar5 = tcu::TextureFormat::getPixelSize
                        ((TextureFormat *)
                         &commonFromatData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      iVar6 = tcu::CompressedTexture::getWidth((CompressedTexture *)&uncompressedFormat);
      iVar7 = tcu::CompressedTexture::getHeight((CompressedTexture *)&uncompressedFormat);
      commonFormatBuffer.super_ConstPixelBufferAccess.m_data._7_1_ = 0;
      paVar1 = (allocator<unsigned_char> *)
               ((long)&commonFormatBuffer.super_ConstPixelBufferAccess.m_data + 6);
      std::allocator<unsigned_char>::allocator(paVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,
                 (long)(iVar5 * iVar6 * iVar7),
                 (value_type_conflict3 *)
                 ((long)&commonFormatBuffer.super_ConstPixelBufferAccess.m_data + 7),paVar1);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&commonFormatBuffer.super_ConstPixelBufferAccess.m_data + 6));
      iVar5 = tcu::CompressedTexture::getWidth((CompressedTexture *)&uncompressedFormat);
      iVar6 = tcu::CompressedTexture::getHeight((CompressedTexture *)&uncompressedFormat);
      puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1f8,
                 (TextureFormat *)
                 &commonFromatData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar5,iVar6,1,puVar12);
      if (level_1.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        pTVar13 = (TestTextureCube *)operator_new(0x188);
        iVar5 = tcu::CompressedTexture::getWidth((CompressedTexture *)&uncompressedFormat);
        vkt::pipeline::TestTextureCube::TestTextureCube
                  (pTVar13,(TextureFormat *)
                           &commonFromatData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,iVar5);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::SharedPtr(&local_208,pTVar13);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::operator=
                  ((SharedPtr<vkt::pipeline::TestTextureCube> *)this,&local_208);
        de::SharedPtr<vkt::pipeline::TestTextureCube>::~SharedPtr(&local_208);
      }
      tcu::TexDecompressionParams::TexDecompressionParams(&local_20c,ASTCMODE_LDR);
      tcu::CompressedTexture::decompress
                ((CompressedTexture *)&uncompressedFormat,(PixelBufferAccess *)&commonFormat,
                 &local_20c);
      tcu::copy((EVP_PKEY_CTX *)local_1f8,(EVP_PKEY_CTX *)&commonFormat);
      pTVar13 = de::SharedPtr<vkt::pipeline::TestTextureCube>::operator->
                          ((SharedPtr<vkt::pipeline::TestTextureCube> *)this);
      (*(pTVar13->super_TestTexture)._vptr_TestTexture[7])
                (local_238,pTVar13,
                 (ulong)(uint)((int)level_1.m_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage / 6),
                 (ulong)(uint)((int)level_1.m_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage % 6));
      tcu::copy(local_238,(EVP_PKEY_CTX *)local_1f8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
      tcu::CompressedTexture::~CompressedTexture((CompressedTexture *)&uncompressedFormat);
    }
  }
  ext.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::~string((string *)local_50);
  pSVar14 = extraout_RDX;
  if ((ext.field_2._M_local_buf[0xb] & 1U) == 0) {
    de::SharedPtr<vkt::pipeline::TestTextureCube>::~SharedPtr
              ((SharedPtr<vkt::pipeline::TestTextureCube> *)this);
    pSVar14 = extraout_RDX_00;
  }
  TVar15.m_state = pSVar14;
  TVar15.m_ptr = (TestTextureCube *)this;
  return TVar15;
}

Assistant:

TestTextureCubeSp loadTextureCube (const tcu::Archive& archive, const std::vector<std::string>& filenames)
{
	DE_ASSERT(filenames.size() > 0);
	DE_STATIC_ASSERT(tcu::CUBEFACE_LAST == 6);
	TCU_CHECK((int)filenames.size() % tcu::CUBEFACE_LAST == 0);

	TestTextureCubeSp texture;

	std::string ext = de::FilePath(filenames[0]).getFileExtension();

	if (ext == "png")
	{

		for (size_t fileIndex = 0; fileIndex < filenames.size(); ++fileIndex)
		{
			tcu::TextureLevel level;

			tcu::ImageIO::loadImage(level, archive, filenames[fileIndex].c_str());

			TCU_CHECK_INTERNAL(level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) ||
											   level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8));

			TCU_CHECK( level.getWidth() == level.getHeight());

			if (fileIndex == 0)
				texture = TestTextureCubeSp(new pipeline::TestTextureCube(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), level.getWidth()));

			tcu::copy(texture->getLevel((int)fileIndex / 6, (int)fileIndex % 6), level.getAccess());
		}
	}
	else if (ext == "pkm")
	{
		for (size_t fileIndex = 0; fileIndex < filenames.size(); ++fileIndex)
		{
			// Compressed texture.
			tcu::CompressedTexture	level;

			tcu::ImageIO::loadPKM(level, archive, filenames[fileIndex].c_str());

			TCU_CHECK( level.getWidth() == level.getHeight());

			tcu::TextureFormat		uncompressedFormat				= tcu::getUncompressedFormat(level.getFormat());
			std::vector<deUint8>	uncompressedData				(uncompressedFormat.getPixelSize() * level.getWidth() * level.getHeight(), 0);
			tcu::PixelBufferAccess	decompressedBuffer				(uncompressedFormat, level.getWidth(), level.getHeight(), 1, uncompressedData.data());

			tcu::TextureFormat		commonFormat					= tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
			std::vector<deUint8>	commonFromatData				(commonFormat.getPixelSize() * level.getWidth() * level.getHeight(), 0);
			tcu::PixelBufferAccess	commonFormatBuffer				(commonFormat, level.getWidth(), level.getHeight(), 1, commonFromatData.data());

			if (fileIndex == 0)
				texture = TestTextureCubeSp(new pipeline::TestTextureCube(commonFormat, level.getWidth()));

			level.decompress(decompressedBuffer, tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR));

			tcu::copy(commonFormatBuffer, decompressedBuffer);
			tcu::copy(texture->getLevel((int)fileIndex / 6, (int)fileIndex % 6), commonFormatBuffer);
		}
	}
	else
		TCU_FAIL("Unsupported file format");

	return texture;
}